

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O1

void __thiscall
txpackage_tests::noncontextual_package_tests::test_method(noncontextual_package_tests *this)

{
  pointer psVar1;
  element_type *peVar2;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  readonly_property65 rVar6;
  bool bVar7;
  readonly_property<bool> rVar8;
  int iVar9;
  long lVar10;
  iterator pvVar11;
  iterator pvVar12;
  CKey *pCVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  const_string file;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  const_string file_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_06;
  const_string file_07;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_08;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_09;
  const_string file_15;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_10;
  const_string file_16;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_11;
  const_string file_17;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_12;
  const_string file_18;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_13;
  const_string file_19;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_14;
  const_string file_20;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_15;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef tx_child;
  CTransactionRef tx_parent;
  CKey placeholder_key_2;
  CKey placeholder_key;
  Package package;
  CMutableTransaction mtx_child_1;
  CMutableTransaction mtx_parent;
  PackageValidationState state;
  CTransactionRef tx_parent_1;
  CMutableTransaction mtx_child;
  CScript spk2;
  CScript spk;
  check_type cVar25;
  char *pcVar20;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffff7ec;
  undefined1 *puVar22;
  uint uVar23;
  undefined8 in_stack_fffffffffffff7f0;
  char *pcVar24;
  undefined8 in_stack_fffffffffffff7f8;
  lazy_ostream *assertion_descr;
  CKey *other;
  undefined8 in_stack_fffffffffffff810;
  char *local_7e0;
  char *local_7d8;
  undefined4 local_7cc;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 local_538 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_530;
  undefined8 local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 local_4a8 [48];
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  shared_count local_378;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_370;
  undefined1 local_368 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_360;
  CTransaction *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  CTransaction *local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  undefined1 local_338 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_330;
  element_type *local_328;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_320;
  undefined1 local_318 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_310;
  undefined1 local_308 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_300;
  undefined1 local_2f8 [8];
  undefined1 local_2f0 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_2e8;
  undefined1 local_2d8 [8];
  __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Stack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  sp_counted_base *local_2b8;
  element_type *local_2b0;
  undefined1 local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  CTransaction *local_298;
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_290;
  undefined1 local_270 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_210;
  undefined8 local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  byte local_1e0;
  direct_or_indirect local_1a0;
  uint local_184;
  undefined1 local_180 [16];
  undefined1 *apuStack_170 [2];
  undefined1 local_160 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158 [2];
  undefined1 local_148 [16];
  undefined8 uStack_138;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  direct_or_indirect local_110;
  uint local_f4;
  undefined1 local_f0 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_d8;
  direct_or_indirect local_b8;
  uint local_9c;
  direct_or_indirect local_98;
  uint local_7c;
  direct_or_indirect local_78;
  uint local_5c;
  undefined1 local_58 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_50;
  undefined8 uStack_40;
  long local_38;
  
  apuStack_170[0] = (undefined1 *)local_180._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81((CKey *)local_308,0));
  CKey::GetPubKey((CPubKey *)local_270,(CKey *)local_308);
  PKHash::PKHash((PKHash *)local_f0,(CPubKey *)local_270);
  local_228._0_8_ = local_f0._0_8_;
  local_228._8_8_ = local_f0._8_8_;
  local_1e0 = 2;
  GetScriptForDestination((CScript *)&local_78.indirect_contents,(CTxDestination *)local_228);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_228);
  GenerateRandomKey(SUB81((CKey *)local_318,0));
  CKey::GetPubKey((CPubKey *)local_270,(CKey *)local_318);
  PKHash::PKHash((PKHash *)local_f0,(CPubKey *)local_270);
  local_218._0_4_ = local_f0._16_4_;
  local_228._0_8_ = local_f0._0_8_;
  local_228._8_8_ = local_f0._8_8_;
  local_1e0 = 2;
  GetScriptForDestination((CScript *)&local_98.indirect_contents,(CTxDestination *)local_228);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_228);
  psVar1 = (((TestChain100Setup *)this)->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_328 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_320 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_320 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_320->_M_use_count = local_320->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_320->_M_use_count = local_320->_M_use_count + 1;
    }
  }
  other = &((TestChain100Setup *)this)->coinbaseKey;
  CKey::CKey((CKey *)local_338,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents);
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key._0_8_ = &local_b8;
  auVar3._4_8_ = in_stack_fffffffffffff7f0;
  auVar3._0_4_ = in_stack_fffffffffffff7ec;
  auVar3._12_8_ = in_stack_fffffffffffff7f8;
  auVar3._20_8_ = this;
  auVar3._28_4_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_328;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)local_270,(TestChain100Setup *)this,input_transaction,0,
             (int)local_338,input_signing_key,(CScript)(auVar3 << 0x20),(CAmount)other,
             SUB81(in_stack_fffffffffffff810,0));
  if (0x1c < local_9c) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_330._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_330,
               local_330._M_head_impl);
  }
  local_330._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_320 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_320);
  }
  local_348 = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_340,&local_348,(allocator<CTransaction> *)local_228,
             (CMutableTransaction *)local_270);
  local_358 = local_348;
  local_350 = local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_368,(CKey *)local_308);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_110.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  _cVar25 = 4800000000;
  pvVar12 = local_368;
  pvVar11 = (iterator)0x65;
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x11e1a3000;
  input_signing_key_00._0_8_ = &local_110;
  auVar4._4_8_ = in_stack_fffffffffffff7f0;
  auVar4._0_4_ = in_stack_fffffffffffff7ec;
  auVar4._12_8_ = in_stack_fffffffffffff7f8;
  auVar4._20_8_ = this;
  auVar4._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_358;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)local_f0,(TestChain100Setup *)this,input_transaction_00,0x65,
             (int)pvVar12,input_signing_key_00,(CScript)(auVar4 << 0x20),(CAmount)other,
             SUB81(in_stack_fffffffffffff810,0));
  if (0x1c < local_f4) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_360._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_360,
               local_360._M_head_impl);
  }
  local_360._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350);
  }
  local_378.pi_ = (sp_counted_base *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_370,(CTransaction **)&local_378,(allocator<CTransaction> *)local_228,
             (CMutableTransaction *)local_f0);
  local_228._8_8_ = &vStack_210;
  local_228._0_8_ = 0;
  local_218 = (undefined1  [8])0x0;
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffffffffff00);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x115;
  file.m_begin = (iterator)&local_388;
  msg.m_end = pvVar12;
  msg.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_398,msg);
  local_2a8 = (undefined1  [8])local_348;
  _Stack_2a0._M_pi = local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_298 = (CTransaction *)local_378.pi_;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)local_2a8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_130,__l,(allocator_type *)local_2f0);
  rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       IsWellFormedPackage((Package *)local_130,(PackageValidationState *)local_228,true);
  local_58[0] = (class_property<bool>)
                (class_property<bool>)
                rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_180._0_8_ = "IsWellFormedPackage({tx_parent, tx_child}, state, true)";
  local_180._8_8_ = (element_type *)0xf6649f;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3a0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_2c0 = (pointer)local_180;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2d8,1,0,WARN,_cVar25,
             (size_t)&local_3a8,0x115);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_130);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x116;
  file_00.m_begin = (iterator)&local_3b8;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3c8,
             msg_00);
  local_2a8 = (undefined1  [8])local_378.pi_;
  _Stack_2a0._M_pi = local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  local_298 = local_348;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_2a8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_130,__l_00,(allocator_type *)local_2f0);
  bVar7 = IsWellFormedPackage((Package *)local_130,(PackageValidationState *)local_228,true);
  local_58[0] = (class_property<bool>)(class_property<bool>)!bVar7;
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_180._0_8_ = "!IsWellFormedPackage({tx_child, tx_parent}, state, true)";
  local_180._8_8_ = (element_type *)0xf664d8;
  assertion_descr = (lazy_ostream *)local_2d8;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3d0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_2c0 = (pointer)local_180;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,assertion_descr,1,0,WARN,_cVar25,(size_t)&local_3d8,0x116)
  ;
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_130);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x117;
  file_01.m_begin = (iterator)&local_3e8;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3f8,
             msg_01);
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_40 = "";
  local_2f0 = (undefined1  [8])local_160;
  local_160._0_4_ = local_228._4_4_;
  local_148._0_8_ = local_4a8;
  local_4a8._0_4_ = 1;
  local_130[0] = local_228._4_4_ == 1;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_180._8_8_ = (element_type *)0xf6592f;
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013b0d30;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2f0;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013b0d30;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  uStack_2c0 = (pointer)local_148;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,2,REQUIRE,0xf67b8d,
             (size_t)local_180,0x117,(int)(iterator)local_2a8,"PackageValidationResult::PCKG_POLICY"
             ,assertion_descr);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x118;
  file_02.m_begin = (iterator)&local_408;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_418,
             msg_02);
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_40 = "";
  local_130._0_8_ = (pointer)&aStack_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,local_228._8_8_,(long)local_218 + local_228._8_8_);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     "package-not-sorted");
  local_180[0] = iVar9 == 0;
  local_180._8_8_ = (element_type *)0x0;
  apuStack_170[0] = (undefined1 *)0x0;
  local_2f0 = (undefined1  [8])0xf658c7;
  local_2e8.px = (element_type *)0xf6592f;
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  local_160 = (undefined1  [8])0xf664d9;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013abf10;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  uStack_2c0 = (pointer)local_160;
  pcVar24 = "\"package-not-sorted\"";
  puVar22 = local_2a8;
  pcVar20 = "state.GetRejectReason()";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_148;
  local_148._0_8_ = (element_type *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_180,(lazy_ostream *)local_58,1,2,REQUIRE,0xf66a9d,
             (size_t)local_2f0,0x118,(int)puVar22);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_170)->_M_allocated_capacity);
  if ((pointer)local_130._0_8_ != (pointer)&aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x119;
  file_03.m_begin = (iterator)&local_428;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_438,
             msg_03);
  local_2a8 = (undefined1  [8])local_348;
  _Stack_2a0._M_pi = local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_298 = (CTransaction *)local_378.pi_;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_2a8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_130,__l_01,(allocator_type *)local_2f0);
  rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsChildWithParents((Package *)local_130);
  local_58[0] = (class_property<bool>)
                (class_property<bool>)
                rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_180._0_8_ = "IsChildWithParents({tx_parent, tx_child})";
  local_180._8_8_ = (element_type *)0xf6652a;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_440 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_2c0 = (pointer)local_180;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2d8,1,0,WARN,(check_type)pcVar20,
             (size_t)&local_448,0x119);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_130);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x11a;
  file_04.m_begin = (iterator)&local_458;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_468,
             msg_04);
  local_2a8 = (undefined1  [8])local_348;
  _Stack_2a0._M_pi = local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_298 = (CTransaction *)local_378.pi_;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_2a8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_130,__l_02,(allocator_type *)local_2f0);
  rVar6.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsChildWithParentsTree((Package *)local_130);
  local_58[0] = (class_property<bool>)
                (class_property<bool>)
                rVar6.super_readonly_property<bool>.super_class_property<bool>.value;
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_180._0_8_ = "IsChildWithParentsTree({tx_parent, tx_child})";
  local_180._8_8_ = (element_type *)0xf66558;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_470 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_2c0 = (pointer)local_180;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2d8,1,0,WARN,(check_type)pcVar20,
             (size_t)&local_478,0x11a);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_130);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2b0 + lVar10));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_4a8._32_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4a8._40_8_ = "";
  local_4a8._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x11b;
  file_05.m_begin = local_4a8 + 0x20;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
             (size_t)(local_4a8 + 0x10),msg_05);
  local_148._0_8_ = local_348;
  local_148._8_8_ = local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_148;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_03,(allocator_type *)local_2f8);
  GetPackageHash((uint256 *)local_2a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_180);
  local_160 = (undefined1  [8])local_378.pi_;
  local_158[0]._M_pi = local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_160;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_2f0,__l_04,(allocator_type *)&local_7cc);
  GetPackageHash((uint256 *)local_2d8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_2f0);
  auVar14[0] = -(local_2a8[0] == (class_property<bool>)local_2d8[0]);
  auVar14[1] = -(local_2a8[1] == local_2d8[1]);
  auVar14[2] = -(local_2a8[2] == local_2d8[2]);
  auVar14[3] = -(local_2a8[3] == local_2d8[3]);
  auVar14[4] = -(local_2a8[4] == local_2d8[4]);
  auVar14[5] = -(local_2a8[5] == local_2d8[5]);
  auVar14[6] = -(local_2a8[6] == local_2d8[6]);
  auVar14[7] = -(local_2a8[7] == local_2d8[7]);
  auVar14[8] = -(_Stack_2a0._M_pi._0_1_ == _Stack_2d0._M_current._0_1_);
  auVar14[9] = -(_Stack_2a0._M_pi._1_1_ == _Stack_2d0._M_current._1_1_);
  auVar14[10] = -(_Stack_2a0._M_pi._2_1_ == _Stack_2d0._M_current._2_1_);
  auVar14[0xb] = -(_Stack_2a0._M_pi._3_1_ == _Stack_2d0._M_current._3_1_);
  auVar14[0xc] = -(_Stack_2a0._M_pi._4_1_ == _Stack_2d0._M_current._4_1_);
  auVar14[0xd] = -(_Stack_2a0._M_pi._5_1_ == _Stack_2d0._M_current._5_1_);
  auVar14[0xe] = -(_Stack_2a0._M_pi._6_1_ == _Stack_2d0._M_current._6_1_);
  auVar14[0xf] = -(_Stack_2a0._M_pi._7_1_ == _Stack_2d0._M_current._7_1_);
  auVar17[0] = -((uchar)local_2c8 == (uchar)local_298);
  auVar17[1] = -(local_2c8._1_1_ == (uchar)((ulong)local_298 >> 8));
  auVar17[2] = -(local_2c8._2_1_ == (uchar)((ulong)local_298 >> 0x10));
  auVar17[3] = -(local_2c8._3_1_ == (uchar)((ulong)local_298 >> 0x18));
  auVar17[4] = -(local_2c8._4_1_ == (uchar)((ulong)local_298 >> 0x20));
  auVar17[5] = -(local_2c8._5_1_ == (uchar)((ulong)local_298 >> 0x28));
  auVar17[6] = -(local_2c8._6_1_ == (uchar)((ulong)local_298 >> 0x30));
  auVar17[7] = -(local_2c8._7_1_ == (uchar)((ulong)local_298 >> 0x38));
  auVar17[8] = -(uStack_2c0._0_1_ ==
                (bool)(uchar)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                             super__Vector_impl_data._M_start);
  auVar17[9] = -(uStack_2c0._1_1_ ==
                (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 8));
  auVar17[10] = -(uStack_2c0._2_1_ ==
                 (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 0x10));
  auVar17[0xb] = -(uStack_2c0._3_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x18));
  auVar17[0xc] = -(uStack_2c0._4_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x20));
  auVar17[0xd] = -(uStack_2c0._5_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x28));
  auVar17[0xe] = -(uStack_2c0._6_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x30));
  auVar17[0xf] = -(uStack_2c0._7_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x38));
  auVar14 = auVar14 & auVar17;
  local_130[0] = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_4a8._0_8_ = "GetPackageHash({tx_parent}) != GetPackageHash({tx_child})";
  local_4a8._8_8_ = "";
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_40 = local_4a8;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4b0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar20,
             (size_t)&local_4b8,0x11b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_2f0);
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158[0]._M_pi);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x11c;
  file_06.m_begin = (iterator)&local_4c8;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4d8,
             msg_06);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_370._M_pi;
  local_2d8 = (undefined1  [8])local_378.pi_;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_378.pi_;
  uStack_2c0 = (pointer)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_2f0,__l_05,(allocator_type *)local_2f8);
  GetPackageHash((uint256 *)local_2a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_2f0);
  local_160 = (undefined1  [8])local_378.pi_;
  local_158[0]._M_pi = local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)local_160;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_148,__l_06,(allocator_type *)&local_7cc);
  GetPackageHash((uint256 *)local_58,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_148);
  auVar18[0] = -(local_58[0] == local_2a8[0]);
  auVar18[1] = -(local_58[1] == local_2a8[1]);
  auVar18[2] = -(local_58[2] == local_2a8[2]);
  auVar18[3] = -(local_58[3] == local_2a8[3]);
  auVar18[4] = -(local_58[4] == local_2a8[4]);
  auVar18[5] = -(local_58[5] == local_2a8[5]);
  auVar18[6] = -(local_58[6] == local_2a8[6]);
  auVar18[7] = -(local_58[7] == local_2a8[7]);
  auVar18[8] = -(sStack_50.px._0_1_ == _Stack_2a0._M_pi._0_1_);
  auVar18[9] = -(sStack_50.px._1_1_ == _Stack_2a0._M_pi._1_1_);
  auVar18[10] = -(sStack_50.px._2_1_ == _Stack_2a0._M_pi._2_1_);
  auVar18[0xb] = -(sStack_50.px._3_1_ == _Stack_2a0._M_pi._3_1_);
  auVar18[0xc] = -(sStack_50.px._4_1_ == _Stack_2a0._M_pi._4_1_);
  auVar18[0xd] = -(sStack_50.px._5_1_ == _Stack_2a0._M_pi._5_1_);
  auVar18[0xe] = -(sStack_50.px._6_1_ == _Stack_2a0._M_pi._6_1_);
  auVar18[0xf] = -(sStack_50.px._7_1_ == _Stack_2a0._M_pi._7_1_);
  auVar15[0] = -((uchar)sStack_50.pn.pi_ == (uchar)local_298);
  auVar15[1] = -(sStack_50.pn.pi_._1_1_ == (uchar)((ulong)local_298 >> 8));
  auVar15[2] = -(sStack_50.pn.pi_._2_1_ == (uchar)((ulong)local_298 >> 0x10));
  auVar15[3] = -(sStack_50.pn.pi_._3_1_ == (uchar)((ulong)local_298 >> 0x18));
  auVar15[4] = -(sStack_50.pn.pi_._4_1_ == (uchar)((ulong)local_298 >> 0x20));
  auVar15[5] = -(sStack_50.pn.pi_._5_1_ == (uchar)((ulong)local_298 >> 0x28));
  auVar15[6] = -(sStack_50.pn.pi_._6_1_ == (uchar)((ulong)local_298 >> 0x30));
  auVar15[7] = -(sStack_50.pn.pi_._7_1_ == (uchar)((ulong)local_298 >> 0x38));
  auVar15[8] = -((uchar)uStack_40 ==
                (uchar)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start);
  auVar15[9] = -(uStack_40._1_1_ ==
                (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 8));
  auVar15[10] = -(uStack_40._2_1_ ==
                 (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 0x10));
  auVar15[0xb] = -(uStack_40._3_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x18));
  auVar15[0xc] = -(uStack_40._4_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x20));
  auVar15[0xd] = -(uStack_40._5_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x28));
  auVar15[0xe] = -(uStack_40._6_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x30));
  auVar15[0xf] = -(uStack_40._7_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x38));
  auVar15 = auVar15 & auVar18;
  local_180[0] = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff;
  local_180._8_8_ = (element_type *)0x0;
  apuStack_170[0] = (undefined1 *)0x0;
  local_4a8._0_8_ = "GetPackageHash({tx_child, tx_child}) != GetPackageHash({tx_child})";
  local_4a8._8_8_ = "";
  local_130._8_8_ = local_130._9_8_ << 8;
  local_130._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_120._8_8_ = local_4a8;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4e0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_180,(lazy_ostream *)local_130,1,0,WARN,(check_type)pcVar20,
             (size_t)&local_4e8,0x11c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_170)->_M_allocated_capacity);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_148);
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158[0]._M_pi);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_2f0);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x11d;
  file_07.m_begin = (iterator)&local_4f8;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_508,
             msg_07);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_370._M_pi;
  local_2d8 = (undefined1  [8])local_378.pi_;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_348;
  uStack_2c0 = (pointer)local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_148,__l_07,(allocator_type *)local_2f8);
  GetPackageHash((uint256 *)local_2a8,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_148);
  local_130._0_8_ = local_378.pi_;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  aStack_120._M_allocated_capacity = (size_type)local_378.pi_;
  local_130._8_8_ = local_370._M_pi;
  aStack_120._8_8_ = local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)local_130;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_160,__l_08,(allocator_type *)&local_7cc);
  GetPackageHash((uint256 *)local_58,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_160);
  auVar19[0] = -(local_58[0] == local_2a8[0]);
  auVar19[1] = -(local_58[1] == local_2a8[1]);
  auVar19[2] = -(local_58[2] == local_2a8[2]);
  auVar19[3] = -(local_58[3] == local_2a8[3]);
  auVar19[4] = -(local_58[4] == local_2a8[4]);
  auVar19[5] = -(local_58[5] == local_2a8[5]);
  auVar19[6] = -(local_58[6] == local_2a8[6]);
  auVar19[7] = -(local_58[7] == local_2a8[7]);
  auVar19[8] = -(sStack_50.px._0_1_ == _Stack_2a0._M_pi._0_1_);
  auVar19[9] = -(sStack_50.px._1_1_ == _Stack_2a0._M_pi._1_1_);
  auVar19[10] = -(sStack_50.px._2_1_ == _Stack_2a0._M_pi._2_1_);
  auVar19[0xb] = -(sStack_50.px._3_1_ == _Stack_2a0._M_pi._3_1_);
  auVar19[0xc] = -(sStack_50.px._4_1_ == _Stack_2a0._M_pi._4_1_);
  auVar19[0xd] = -(sStack_50.px._5_1_ == _Stack_2a0._M_pi._5_1_);
  auVar19[0xe] = -(sStack_50.px._6_1_ == _Stack_2a0._M_pi._6_1_);
  auVar19[0xf] = -(sStack_50.px._7_1_ == _Stack_2a0._M_pi._7_1_);
  auVar16[0] = -((uchar)sStack_50.pn.pi_ == (uchar)local_298);
  auVar16[1] = -(sStack_50.pn.pi_._1_1_ == (uchar)((ulong)local_298 >> 8));
  auVar16[2] = -(sStack_50.pn.pi_._2_1_ == (uchar)((ulong)local_298 >> 0x10));
  auVar16[3] = -(sStack_50.pn.pi_._3_1_ == (uchar)((ulong)local_298 >> 0x18));
  auVar16[4] = -(sStack_50.pn.pi_._4_1_ == (uchar)((ulong)local_298 >> 0x20));
  auVar16[5] = -(sStack_50.pn.pi_._5_1_ == (uchar)((ulong)local_298 >> 0x28));
  auVar16[6] = -(sStack_50.pn.pi_._6_1_ == (uchar)((ulong)local_298 >> 0x30));
  auVar16[7] = -(sStack_50.pn.pi_._7_1_ == (uchar)((ulong)local_298 >> 0x38));
  auVar16[8] = -((uchar)uStack_40 ==
                (uchar)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start);
  auVar16[9] = -(uStack_40._1_1_ ==
                (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 8));
  auVar16[10] = -(uStack_40._2_1_ ==
                 (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 0x10));
  auVar16[0xb] = -(uStack_40._3_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x18));
  auVar16[0xc] = -(uStack_40._4_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x20));
  auVar16[0xd] = -(uStack_40._5_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x28));
  auVar16[0xe] = -(uStack_40._6_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x30));
  auVar16[0xf] = -(uStack_40._7_1_ ==
                  (uchar)((ulong)vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 0x38));
  auVar16 = auVar16 & auVar19;
  local_2f0[0] = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff;
  local_2e8.px = (element_type *)0x0;
  local_2e8.pn.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "GetPackageHash({tx_child, tx_parent}) != GetPackageHash({tx_child, tx_child})";
  local_4a8._8_8_ = "";
  local_180._8_8_ = local_180._9_8_ << 8;
  local_180._0_8_ = &PTR__lazy_ostream_013abc70;
  apuStack_170[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_170[1] = local_4a8;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_510 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f0,(lazy_ostream *)local_180,1,0,WARN,(check_type)pcVar20,
             (size_t)&local_518,0x11d);
  boost::detail::shared_count::~shared_count(&local_2e8.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_160);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_138 + lVar10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_138 + lVar10));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_148);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage != &local_1f0) {
    operator_delete(vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  if ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_228._8_8_ != &vStack_210) {
    operator_delete((void *)local_228._8_8_,
                    (long)vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
  }
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_370._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f0);
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_258);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_270);
  local_2d8 = (undefined1  [8])0x0;
  _Stack_2d0._M_current._0_1_ = false;
  _Stack_2d0._M_current._1_7_ = 0;
  local_2c8 = (undefined1 *)0x0;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_f0);
  lVar10 = 0x18;
  do {
    psVar1 = (((TestChain100Setup *)this)->m_coinbase_txns).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_528 = *(undefined8 *)((long)psVar1 + lVar10 + -8);
    local_520 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar10);
    if (local_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_520->_M_use_count = local_520->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_520->_M_use_count = local_520->_M_use_count + 1;
      }
    }
    CKey::CKey((CKey *)local_538,other);
    uVar23 = (uint)((ulong)puVar22 >> 0x20);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents);
    _cVar25 = 4800000000;
    pvVar12 = (iterator)0x0;
    input_signing_key_01.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )0x11e1a3000;
    input_signing_key_01._0_8_ = &local_1a0;
    auVar5._4_8_ = pcVar24;
    auVar5._0_4_ = uVar23;
    auVar5._12_8_ = assertion_descr;
    auVar5._20_8_ = this;
    auVar5._28_4_ = 0;
    input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_528;
    pCVar13 = (CKey *)local_538;
    TestChain100Setup::CreateValidMempoolTransaction
              ((CMutableTransaction *)local_228,(TestChain100Setup *)this,input_transaction_01,0,
               (int)(CKey *)local_538,input_signing_key_01,(CScript)(auVar5 << 0x20),(CAmount)other,
               SUB81(in_stack_fffffffffffff810,0));
    local_270 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268,(CTransaction **)local_270,
               (allocator<CTransaction> *)local_2a8,(CMutableTransaction *)local_228);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_210);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_228);
    if (0x1c < local_184) {
      free(local_1a0.indirect_contents.indirect);
      local_1a0.indirect_contents.indirect = (char *)0x0;
    }
    if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_530._M_head_impl !=
        (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_530,
                 local_530._M_head_impl);
    }
    local_530._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
    if (local_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520);
    }
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)local_2d8,(shared_ptr<const_CTransaction> *)local_270);
    local_228._0_8_ =
         *(undefined8 *)
          (((Txid *)((long)local_270 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    local_228._8_8_ =
         *(undefined8 *)
          ((((Txid *)((long)local_270 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8
          );
    local_218 = *(undefined1 (*) [8])
                 ((((Txid *)((long)local_270 + 0x39))->m_wrapped).super_base_blob<256U>.m_data.
                  _M_elems + 0x10);
    vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)
                ((((Txid *)((long)local_270 + 0x39))->m_wrapped).super_base_blob<256U>.m_data.
                 _M_elems + 0x18);
    vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f0,(COutPoint *)local_228);
    if (local_268.px != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.px);
    }
    puVar22 = (undefined1 *)((ulong)uVar23 << 0x20);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x198);
  local_228._0_8_ = 4700000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_d8,(long *)local_228,
             (CScript *)&local_98.indirect_contents);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x12d;
  file_08.m_begin = (iterator)&local_548;
  msg_08.m_end = &pCVar13->fCompressed;
  msg_08.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_558,
             msg_08);
  bVar7 = IsChildWithParents((Package *)local_2d8);
  local_270[0] = !bVar7;
  local_268.px = (element_type *)0x0;
  local_268.pn.pi_ = (sp_counted_base *)0x0;
  local_2a8 = (undefined1  [8])0xf66624;
  _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf66640;
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = &PTR__lazy_ostream_013abc70;
  local_218 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2a8;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_560 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_270,(lazy_ostream *)local_228,1,0,WARN,_cVar25,
             (size_t)&local_568,0x12d);
  boost::detail::shared_count::~shared_count(&local_268.pn);
  FastRandomContext::FastRandomContext((FastRandomContext *)local_228,false);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,FastRandomContext&>
            ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              )local_2d8,_Stack_2d0,(FastRandomContext *)local_228);
  local_270 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268,(CTransaction **)local_270,
             (allocator<CTransaction> *)local_2a8,(CMutableTransaction *)local_f0);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)local_2d8,(shared_ptr<const_CTransaction> *)local_270);
  if (local_268.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.px);
  }
  local_270 = (undefined1  [8])0x0;
  local_268.pn.pi_ = (sp_counted_base *)0x0;
  local_268.px = (element_type *)&local_258;
  local_258._M_local_buf[0] = '\0';
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x135;
  file_09.m_begin = (iterator)&local_578;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar12;
  local_248._M_p = (pointer)&local_238;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_588,
             msg_09);
  rVar8.super_class_property<bool>.value =
       (class_property<bool>)
       IsWellFormedPackage((Package *)local_2d8,(PackageValidationState *)local_270,true);
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "IsWellFormedPackage(package, state, true)";
  local_130._8_8_ = "";
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_130;
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_590 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_58[0] = rVar8.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2a8,1,0,WARN,_cVar25,
             (size_t)&local_598,0x135);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x136;
  file_10.m_begin = (iterator)&local_5a8;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5b8,
             msg_10);
  local_58[0] = (class_property<bool>)IsChildWithParents((Package *)local_2d8);
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "IsChildWithParents(package)";
  local_130._8_8_ = "";
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_130;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5c0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2a8,1,0,WARN,_cVar25,
             (size_t)&local_5c8,0x136);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x137;
  file_11.m_begin = (iterator)&local_5d8;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5e8,
             msg_11);
  local_58[0] = (class_property<bool>)IsChildWithParentsTree((Package *)local_2d8);
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "IsChildWithParentsTree(package)";
  local_130._8_8_ = "";
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_130;
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5f0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2a8,1,0,WARN,_cVar25,
             (size_t)&local_5f8,0x137);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_erase((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_2d8,(iterator)local_2d8);
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x13a;
  file_12.m_begin = (iterator)&local_608;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_618,
             msg_12);
  local_58[0] = (class_property<bool>)IsChildWithParents((Package *)local_2d8);
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "IsChildWithParents(package)";
  local_130._8_8_ = "";
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_130;
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_620 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2a8,1,0,WARN,_cVar25,
             (size_t)&local_628,0x13a);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::insert((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_2d8,(const_iterator)local_2d8,
           (((TestChain100Setup *)this)->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start);
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x13e;
  file_13.m_begin = (iterator)&local_638;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_648,
             msg_13);
  bVar7 = IsChildWithParents((Package *)local_2d8);
  local_58[0] = (class_property<bool>)(class_property<bool>)!bVar7;
  sStack_50.px = (element_type *)0x0;
  sStack_50.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "!IsChildWithParents(package)";
  local_130._8_8_ = (element_type *)0xf66640;
  _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffffffffff00;
  local_2a8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_298 = (CTransaction *)boost::unit_test::lazy_ostream::inst;
  vStack_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_130;
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_650 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2a8,1,0,WARN,_cVar25,
             (size_t)&local_658,0x13e);
  boost::detail::shared_count::~shared_count(&sStack_50.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != &local_238) {
    operator_delete(local_248._M_p,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.px != &local_258) {
    operator_delete(local_268.px,
                    CONCAT71(local_258._M_allocated_capacity._1_7_,local_258._M_local_buf[0]) + 1);
  }
  ChaCha20::~ChaCha20((ChaCha20 *)local_218);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_2d8);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_270);
  peVar2 = (((((TestChain100Setup *)this)->m_coinbase_txns).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_228._0_8_ = *(undefined8 *)&(peVar2->hash).m_wrapped;
  local_228._8_8_ = *(undefined8 *)((long)&peVar2->hash + 8);
  local_218 = *(undefined1 (*) [8])((long)&peVar2->hash + 0x10);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)((long)&peVar2->hash + 0x18);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_270,(COutPoint *)local_228);
  local_228._0_8_ = 2000000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)local_258._M_local_buf,(long *)local_228,
             (CScript *)&local_78.indirect_contents);
  local_228._0_8_ = 2000000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)local_258._M_local_buf,(long *)local_228,
             (CScript *)&local_98.indirect_contents);
  local_160 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (local_158,(CTransaction **)local_160,(allocator<CTransaction> *)local_228,
             (CMutableTransaction *)local_270);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_f0);
  local_228._0_8_ =
       *(undefined8 *)
        (((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  local_228._8_8_ =
       *(undefined8 *)
        ((((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_218 = *(undefined1 (*) [8])
               ((((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data.
                _M_elems + 0x10);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)
              ((((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems
              + 0x18);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f0,(COutPoint *)local_228);
  local_228._0_8_ = 2000000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_d8,(long *)local_228,
             (CScript *)&local_78.indirect_contents);
  local_348 = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_340,&local_348,(allocator<CTransaction> *)local_228,
             (CMutableTransaction *)local_f0);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_2a8);
  local_228._0_8_ =
       *(undefined8 *)
        (((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  local_228._8_8_ =
       *(undefined8 *)
        ((((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_218 = *(undefined1 (*) [8])
               ((((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data.
                _M_elems + 0x10);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)
              ((((Txid *)((long)local_160 + 0x39))->m_wrapped).super_base_blob<256U>.m_data._M_elems
              + 0x18);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,(COutPoint *)local_228);
  local_228._0_8_ = *(undefined8 *)(local_348->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
  ;
  local_228._8_8_ =
       *(undefined8 *)((local_348->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_218 = *(undefined1 (*) [8])
               ((local_348->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)((local_348->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8,(COutPoint *)local_228);
  local_228._0_8_ = 3900000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&vStack_290,(long *)local_228,
             (CScript *)&local_78.indirect_contents);
  local_378.pi_ = (sp_counted_base *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_370,(CTransaction **)&local_378,(allocator<CTransaction> *)local_228,
             (CMutableTransaction *)local_2a8);
  local_228._0_8_ = 0;
  local_228._8_8_ = &vStack_210;
  local_218 = (undefined1  [8])0x0;
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffffffffff00);
  vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x155;
  file_14.m_begin = (iterator)&local_668;
  msg_14.m_end = pvVar11;
  msg_14.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_678,
             msg_14);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_158[0]._M_pi;
  local_2d8 = local_160;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_348;
  uStack_2c0 = (pointer)local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_09,(allocator_type *)local_148);
  bVar7 = IsChildWithParents((Package *)local_180);
  local_130[0] = bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf6668b;
  local_2e8.px = (element_type *)0xf666c0;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_680 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_688,0x155);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x156;
  file_15.m_begin = (iterator)&local_698;
  msg_15.m_end = pvVar11;
  msg_15.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_6a8,
             msg_15);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_158[0]._M_pi;
  local_2d8 = local_160;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_378.pi_;
  uStack_2c0 = (pointer)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_10,(allocator_type *)local_148);
  bVar7 = IsChildWithParents((Package *)local_180);
  local_130[0] = bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf66501;
  local_2e8.px = (element_type *)0xf6652a;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6b0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_6b8,0x156);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x157;
  file_16.m_begin = (iterator)&local_6c8;
  msg_16.m_end = pvVar11;
  msg_16.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_6d8,
             msg_16);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_158[0]._M_pi;
  local_2d8 = local_160;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_348;
  uStack_2c0 = (pointer)local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8 = local_378.pi_;
  local_2b0 = (element_type *)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_11,(allocator_type *)local_148);
  bVar7 = IsChildWithParents((Package *)local_180);
  local_130[0] = bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf666c1;
  local_2e8.px = (element_type *)0xf66700;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6e0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_6e8,0x157);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x158;
  file_17.m_begin = (iterator)&local_6f8;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_708,
             msg_17);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_158[0]._M_pi;
  local_2d8 = local_160;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_348;
  uStack_2c0 = (pointer)local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8 = local_378.pi_;
  local_2b0 = (element_type *)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_12,(allocator_type *)local_148);
  bVar7 = IsChildWithParentsTree((Package *)local_180);
  local_130[0] = !bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf66701;
  local_2e8.px = (element_type *)0xf66745;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_710 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_718,0x158);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x15a;
  file_18.m_begin = (iterator)&local_728;
  msg_18.m_end = pvVar11;
  msg_18.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_738,
             msg_18);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_340._M_pi;
  local_2d8 = (undefined1  [8])local_348;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_160;
  uStack_2c0 = (pointer)local_158[0]._M_pi;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8 = local_378.pi_;
  local_2b0 = (element_type *)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_13,(allocator_type *)local_148);
  bVar7 = IsChildWithParents((Package *)local_180);
  local_130[0] = bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf66746;
  local_2e8.px = (element_type *)0xf66785;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_740 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_748,0x15a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x15b;
  file_19.m_begin = (iterator)&local_758;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_768,
             msg_19);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_158[0]._M_pi;
  local_2d8 = local_160;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_348;
  uStack_2c0 = (pointer)local_340._M_pi;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8 = local_378.pi_;
  local_2b0 = (element_type *)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_14._M_len = 3;
  __l_14._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_14,(allocator_type *)local_148);
  bVar7 = IsWellFormedPackage((Package *)local_180,(PackageValidationState *)local_228,true);
  local_130[0] = bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf66786;
  local_2e8.px = (element_type *)0xf667d3;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_770 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_778,0x15b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x15c;
  file_20.m_begin = (iterator)&local_788;
  msg_20.m_end = pvVar11;
  msg_20.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_798,
             msg_20);
  _Stack_2d0._M_current = (shared_ptr<const_CTransaction> *)local_340._M_pi;
  local_2d8 = (undefined1  [8])local_348;
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340._M_pi)->_M_use_count = (local_340._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = (undefined1 *)local_160;
  uStack_2c0 = (pointer)local_158[0]._M_pi;
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158[0]._M_pi)->_M_use_count = (local_158[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8 = local_378.pi_;
  local_2b0 = (element_type *)local_370._M_pi;
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_370._M_pi)->_M_use_count = (local_370._M_pi)->_M_use_count + 1;
    }
  }
  __l_15._M_len = 3;
  __l_15._M_array = (iterator)local_2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_180,__l_15,(allocator_type *)local_148);
  bVar7 = IsWellFormedPackage((Package *)local_180,(PackageValidationState *)local_228,true);
  local_130[0] = !bVar7;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_2f0 = (undefined1  [8])0xf667d4;
  local_2e8.px = (element_type *)0xf66822;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7a0 = "";
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  uStack_40 = local_2f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)local_58,1,0,WARN,_cVar25,
             (size_t)&local_7a8,0x15c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_180);
  lVar10 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2d8 + lVar10 + -8));
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x15d;
  file_21.m_begin = (iterator)&local_7b8;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_7c8,
             msg_21);
  local_130._8_8_ = local_130._9_8_ << 8;
  local_130._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_120._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2f8._0_4_ = local_228._4_4_;
  local_180[0] = local_228._4_4_ == 1;
  local_7cc = 1;
  local_180._8_8_ = (element_type *)0x0;
  apuStack_170[0] = (undefined1 *)0x0;
  local_2f0 = (undefined1  [8])0xf658c7;
  local_2e8.px = (element_type *)0xf6592f;
  local_148._0_8_ = local_2f8;
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013b0d30;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_4a8._0_8_ = &local_7cc;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013b0d30;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_40 = local_4a8;
  uVar21 = SUB84((iterator)local_2d8,0);
  pvVar12 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  uStack_2c0 = (pointer)local_148;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_180,(lazy_ostream *)local_130,1,2,REQUIRE,0xf67b8d,
             (size_t)local_2f0,0x15d,uVar21,"PackageValidationResult::PCKG_POLICY",
             (lazy_ostream *)local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_170)->_M_allocated_capacity);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7d8 = "";
  file_22.m_end = (iterator)0x15e;
  file_22.m_begin = (iterator)&local_7e0;
  msg_22.m_end = pvVar11;
  msg_22.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
             (size_t)&stack0xfffffffffffff810,msg_22);
  local_130._8_8_ = local_130._9_8_ << 8;
  local_130._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_120._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_180._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)apuStack_170;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,local_228._8_8_,(long)local_218 + local_228._8_8_);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     "package-not-sorted");
  local_2f0[0] = iVar9 == 0;
  local_2e8.px = (element_type *)0x0;
  local_2e8.pn.pi_ = (sp_counted_base *)0x0;
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_148._8_8_ = "";
  _Stack_2d0._M_current._0_1_ = false;
  local_2d8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  uStack_2c0 = (pointer)local_4a8;
  local_2f8 = (undefined1  [8])0xf664d9;
  sStack_50.px = (element_type *)(sStack_50._1_8_ << 8);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abf10;
  sStack_50.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_40 = local_2f8;
  local_4a8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f0,(lazy_ostream *)local_130,1,2,REQUIRE,0xf66a9d,
             (size_t)local_148,0x15e,uVar21,"\"package-not-sorted\"",(lazy_ostream *)local_58);
  boost::detail::shared_count::~shared_count(&local_2e8.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_170) {
    operator_delete((void *)local_180._0_8_,(ulong)((long)apuStack_170[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage != &local_1f0) {
    operator_delete(vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  if ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_228._8_8_ != &vStack_210) {
    operator_delete((void *)local_228._8_8_,
                    (long)vStack_210.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
  }
  if (local_370._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_370._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f0);
  if (local_158[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158[0]._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_258);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_270);
  if (0x1c < local_7c) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if (local_310._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_310,
               local_310._M_head_impl);
  }
  if (0x1c < local_5c) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_300._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_300,
               (array<unsigned_char,_32UL> *)
               local_300._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(noncontextual_package_tests)
{
    // The signatures won't be verified so we can just use a placeholder
    CKey placeholder_key = GenerateRandomKey();
    CScript spk = GetScriptForDestination(PKHash(placeholder_key.GetPubKey()));
    CKey placeholder_key_2 = GenerateRandomKey();
    CScript spk2 = GetScriptForDestination(PKHash(placeholder_key_2.GetPubKey()));

    // Parent and Child Package
    {
        auto mtx_parent = CreateValidMempoolTransaction(m_coinbase_txns[0], 0, 0, coinbaseKey, spk,
                                                        CAmount(49 * COIN), /*submit=*/false);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

        auto mtx_child = CreateValidMempoolTransaction(tx_parent, 0, 101, placeholder_key, spk2,
                                                       CAmount(48 * COIN), /*submit=*/false);
        CTransactionRef tx_child = MakeTransactionRef(mtx_child);

        PackageValidationState state;
        BOOST_CHECK(IsWellFormedPackage({tx_parent, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK(!IsWellFormedPackage({tx_child, tx_parent}, state, /*require_sorted=*/true));
        BOOST_CHECK_EQUAL(state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(state.GetRejectReason(), "package-not-sorted");
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_child}));
        BOOST_CHECK(IsChildWithParentsTree({tx_parent, tx_child}));
        BOOST_CHECK(GetPackageHash({tx_parent}) != GetPackageHash({tx_child}));
        BOOST_CHECK(GetPackageHash({tx_child, tx_child}) != GetPackageHash({tx_child}));
        BOOST_CHECK(GetPackageHash({tx_child, tx_parent}) != GetPackageHash({tx_child, tx_child}));
    }

    // 24 Parents and 1 Child
    {
        Package package;
        CMutableTransaction child;
        for (int i{0}; i < 24; ++i) {
            auto parent = MakeTransactionRef(CreateValidMempoolTransaction(m_coinbase_txns[i + 1],
                                             0, 0, coinbaseKey, spk, CAmount(48 * COIN), false));
            package.emplace_back(parent);
            child.vin.emplace_back(COutPoint(parent->GetHash(), 0));
        }
        child.vout.emplace_back(47 * COIN, spk2);

        // The child must be in the package.
        BOOST_CHECK(!IsChildWithParents(package));

        // The parents can be in any order.
        FastRandomContext rng;
        std::shuffle(package.begin(), package.end(), rng);
        package.push_back(MakeTransactionRef(child));

        PackageValidationState state;
        BOOST_CHECK(IsWellFormedPackage(package, state, /*require_sorted=*/true));
        BOOST_CHECK(IsChildWithParents(package));
        BOOST_CHECK(IsChildWithParentsTree(package));

        package.erase(package.begin());
        BOOST_CHECK(IsChildWithParents(package));

        // The package cannot have unrelated transactions.
        package.insert(package.begin(), m_coinbase_txns[0]);
        BOOST_CHECK(!IsChildWithParents(package));
    }

    // 2 Parents and 1 Child where one parent depends on the other.
    {
        CMutableTransaction mtx_parent;
        mtx_parent.vin.emplace_back(COutPoint(m_coinbase_txns[0]->GetHash(), 0));
        mtx_parent.vout.emplace_back(20 * COIN, spk);
        mtx_parent.vout.emplace_back(20 * COIN, spk2);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

        CMutableTransaction mtx_parent_also_child;
        mtx_parent_also_child.vin.emplace_back(COutPoint(tx_parent->GetHash(), 0));
        mtx_parent_also_child.vout.emplace_back(20 * COIN, spk);
        CTransactionRef tx_parent_also_child = MakeTransactionRef(mtx_parent_also_child);

        CMutableTransaction mtx_child;
        mtx_child.vin.emplace_back(COutPoint(tx_parent->GetHash(), 1));
        mtx_child.vin.emplace_back(COutPoint(tx_parent_also_child->GetHash(), 0));
        mtx_child.vout.emplace_back(39 * COIN, spk);
        CTransactionRef tx_child = MakeTransactionRef(mtx_child);

        PackageValidationState state;
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_parent_also_child}));
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_child}));
        BOOST_CHECK(IsChildWithParents({tx_parent, tx_parent_also_child, tx_child}));
        BOOST_CHECK(!IsChildWithParentsTree({tx_parent, tx_parent_also_child, tx_child}));
        // IsChildWithParents does not detect unsorted parents.
        BOOST_CHECK(IsChildWithParents({tx_parent_also_child, tx_parent, tx_child}));
        BOOST_CHECK(IsWellFormedPackage({tx_parent, tx_parent_also_child, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK(!IsWellFormedPackage({tx_parent_also_child, tx_parent, tx_child}, state, /*require_sorted=*/true));
        BOOST_CHECK_EQUAL(state.GetResult(), PackageValidationResult::PCKG_POLICY);
        BOOST_CHECK_EQUAL(state.GetRejectReason(), "package-not-sorted");
    }
}